

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallFilesGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallFilesGenerator *this,string *config)

{
  cmLocalGenerator *lg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> config_00;
  pointer this_00;
  string *psVar1;
  string local_80;
  cmGeneratorExpression local_60;
  cmListFileBacktrace local_48;
  undefined1 local_30 [8];
  cmGeneratorExpression ge;
  string *config_local;
  cmInstallFilesGenerator *this_local;
  
  local_48.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ge.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)config;
  cmListFileBacktrace::cmListFileBacktrace(&local_48);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_30,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  cmGeneratorExpression::Parse(&local_60,(string *)local_30);
  this_00 = std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          *)&local_60);
  config_00 = ge.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  lg = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_80);
  psVar1 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,lg,(string *)config_00._M_pi,false,(cmGeneratorTarget *)0x0,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_80);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_80);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_60);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallFilesGenerator::GetDestination(
  std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)->Evaluate(this->LocalGenerator, config);
}